

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::boxMesh(Mesh *__return_storage_ptr__,float _width,float _height,float _depth,int _resX,
                    int _resY,int _resZ)

{
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  int local_118;
  int local_114;
  int x_5;
  int y_5;
  int ix_5;
  int iy_5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_100;
  int local_fc;
  int local_f8;
  int x_4;
  int y_4;
  int ix_4;
  int iy_4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_e4;
  int local_e0;
  int local_dc;
  int x_3;
  int y_3;
  int ix_3;
  int iy_3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_c8;
  int local_c4;
  int local_c0;
  int x_2;
  int y_2;
  int ix_2;
  int iy_2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_ac;
  int local_a8;
  int local_a4;
  int x_1;
  int y_1;
  int ix_1;
  int iy_1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_90;
  int local_8c;
  int local_88;
  int x;
  int y;
  int ix;
  int iy;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_74;
  size_t local_70;
  size_t vertOffset;
  vec2 texcoord;
  vec3 normal;
  vec3 vert;
  float halfD;
  float halfH;
  float halfW;
  int local_28;
  int local_24;
  int _resZ_local;
  int _resY_local;
  int _resX_local;
  float _depth_local;
  float _height_local;
  float _width_local;
  Mesh *mesh;
  
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::setDrawMode(__return_storage_ptr__,TRIANGLES);
  _resZ_local = _resX + 1;
  local_24 = _resY + 1;
  local_28 = _resZ + 1;
  if (_resZ_local < 2) {
    _resZ_local = 0;
  }
  if (local_24 < 2) {
    local_24 = 0;
  }
  if (local_28 < 2) {
    local_28 = 0;
  }
  aVar1.y = _width * 0.5;
  aVar2.z = _height * 0.5;
  local_70 = 0;
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix,0.0,0.0,1.0);
  texcoord = _ix;
  normal.field_0 = local_74;
  for (y = 0; y < local_24; y = y + 1) {
    for (x = 0; x < _resZ_local; x = x + 1) {
      vertOffset._0_4_ = (float)x / ((float)_resZ_local - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y / ((float)local_24 - 1.0);
      normal.field_1.y = (float)vertOffset * _width - aVar1.y;
      normal.field_2.z = -(vertOffset._4_4_ - 1.0) * _height - aVar2.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_88 = 0; local_88 < local_24 + -1; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < _resZ_local + -1; local_8c = local_8c + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_88 * _resZ_local + local_8c + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_88 * _resZ_local + local_8c);
      Mesh::addIndex(__return_storage_ptr__,(local_88 + 1) * _resZ_local + local_8c + (int)local_70)
      ;
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_88 * _resZ_local + local_8c);
      Mesh::addIndex(__return_storage_ptr__,
                     (int)local_70 + 1 + (local_88 + 1) * _resZ_local + local_8c);
      Mesh::addIndex(__return_storage_ptr__,(local_88 + 1) * _resZ_local + local_8c + (int)local_70)
      ;
    }
  }
  local_70 = Mesh::getVerticesTotal(__return_storage_ptr__);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_1,1.0,0.0,0.0);
  texcoord = _ix_1;
  normal.field_0 = local_90;
  for (y_1 = 0; y_1 < local_24; y_1 = y_1 + 1) {
    for (x_1 = 0; x_1 < local_28; x_1 = x_1 + 1) {
      vertOffset._0_4_ = (float)x_1 / ((float)local_28 - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y_1 / ((float)local_24 - 1.0);
      normal.field_2.z = -(vertOffset._4_4_ - 1.0) * _height - aVar2.z;
      normal.field_1.y = aVar1.y;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_a4 = 0; local_a4 < local_24 + -1; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < local_28 + -1; local_a8 = local_a8 + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_a4 * local_28 + local_a8 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_a4 * local_28 + local_a8);
      Mesh::addIndex(__return_storage_ptr__,(local_a4 + 1) * local_28 + local_a8 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_a4 * local_28 + local_a8);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + (local_a4 + 1) * local_28 + local_a8
                    );
      Mesh::addIndex(__return_storage_ptr__,(local_a4 + 1) * local_28 + local_a8 + (int)local_70);
    }
  }
  local_70 = Mesh::getVerticesTotal(__return_storage_ptr__);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_2,-1.0,0.0,0.0)
  ;
  texcoord = _ix_2;
  normal.field_0 = local_ac;
  for (y_2 = 0; y_2 < local_24; y_2 = y_2 + 1) {
    for (x_2 = 0; x_2 < local_28; x_2 = x_2 + 1) {
      vertOffset._0_4_ = (float)x_2 / ((float)local_28 - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y_2 / ((float)local_24 - 1.0);
      normal.field_1.y = -aVar1.y;
      normal.field_2.z = -(vertOffset._4_4_ - 1.0) * _height - aVar2.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_c0 = 0; local_c0 < local_24 + -1; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < local_28 + -1; local_c4 = local_c4 + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_c0 * local_28 + local_c4 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_c0 * local_28 + local_c4);
      Mesh::addIndex(__return_storage_ptr__,(local_c0 + 1) * local_28 + local_c4 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_c0 * local_28 + local_c4);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + (local_c0 + 1) * local_28 + local_c4
                    );
      Mesh::addIndex(__return_storage_ptr__,(local_c0 + 1) * local_28 + local_c4 + (int)local_70);
    }
  }
  local_70 = Mesh::getVerticesTotal(__return_storage_ptr__);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_3,0.0,0.0,-1.0)
  ;
  texcoord = _ix_3;
  normal.field_0 = local_c8;
  for (y_3 = 0; y_3 < local_24; y_3 = y_3 + 1) {
    for (x_3 = 0; x_3 < _resZ_local; x_3 = x_3 + 1) {
      vertOffset._0_4_ = (float)x_3 / ((float)_resZ_local - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y_3 / ((float)local_24 - 1.0);
      normal.field_1.y = aVar1.y - (float)vertOffset * _width;
      normal.field_2.z = -(vertOffset._4_4_ - 1.0) * _height - aVar2.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_dc = 0; local_dc < local_24 + -1; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < _resZ_local + -1; local_e0 = local_e0 + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_dc * _resZ_local + local_e0 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_dc * _resZ_local + local_e0);
      Mesh::addIndex(__return_storage_ptr__,(local_dc + 1) * _resZ_local + local_e0 + (int)local_70)
      ;
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_dc * _resZ_local + local_e0);
      Mesh::addIndex(__return_storage_ptr__,
                     (int)local_70 + 1 + (local_dc + 1) * _resZ_local + local_e0);
      Mesh::addIndex(__return_storage_ptr__,(local_dc + 1) * _resZ_local + local_e0 + (int)local_70)
      ;
    }
  }
  local_70 = Mesh::getVerticesTotal(__return_storage_ptr__);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_4,0.0,-1.0,0.0)
  ;
  texcoord = _ix_4;
  normal.field_0 = local_e4;
  for (y_4 = 0; y_4 < local_28; y_4 = y_4 + 1) {
    for (x_4 = 0; x_4 < _resZ_local; x_4 = x_4 + 1) {
      vertOffset._0_4_ = (float)x_4 / ((float)_resZ_local - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y_4 / ((float)local_28 - 1.0);
      normal.field_1.y = (float)vertOffset * _width - aVar1.y;
      normal.field_2.z = -aVar2.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_f8 = 0; local_f8 < local_28 + -1; local_f8 = local_f8 + 1) {
    for (local_fc = 0; local_fc < _resZ_local + -1; local_fc = local_fc + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_f8 * _resZ_local + local_fc + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(local_f8 + 1) * _resZ_local + local_fc + (int)local_70)
      ;
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_f8 * _resZ_local + local_fc);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_f8 * _resZ_local + local_fc);
      Mesh::addIndex(__return_storage_ptr__,(local_f8 + 1) * _resZ_local + local_fc + (int)local_70)
      ;
      Mesh::addIndex(__return_storage_ptr__,
                     (int)local_70 + 1 + (local_f8 + 1) * _resZ_local + local_fc);
    }
  }
  local_70 = Mesh::getVerticesTotal(__return_storage_ptr__);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix_5,0.0,1.0,0.0);
  texcoord = _ix_5;
  normal.field_0 = local_100;
  for (y_5 = 0; y_5 < local_28; y_5 = y_5 + 1) {
    for (x_5 = 0; x_5 < _resZ_local; x_5 = x_5 + 1) {
      vertOffset._0_4_ = (float)x_5 / ((float)_resZ_local - 1.0);
      vertOffset._4_4_ = 1.0 - (float)y_5 / ((float)local_28 - 1.0);
      normal.field_1.y = (float)vertOffset * _width - aVar1.y;
      normal.field_2.z = aVar2.z;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&vertOffset);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  for (local_114 = 0; local_114 < local_28 + -1; local_114 = local_114 + 1) {
    for (local_118 = 0; local_118 < _resZ_local + -1; local_118 = local_118 + 1) {
      Mesh::addIndex(__return_storage_ptr__,local_114 * _resZ_local + local_118 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,
                     (local_114 + 1) * _resZ_local + local_118 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_114 * _resZ_local + local_118)
      ;
      Mesh::addIndex(__return_storage_ptr__,(int)local_70 + 1 + local_114 * _resZ_local + local_118)
      ;
      Mesh::addIndex(__return_storage_ptr__,
                     (local_114 + 1) * _resZ_local + local_118 + (int)local_70);
      Mesh::addIndex(__return_storage_ptr__,
                     (int)local_70 + 1 + (local_114 + 1) * _resZ_local + local_118);
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh boxMesh( float _width, float _height, float _depth, int _resX, int _resY, int _resZ ) {

    // mesh only available as triangles //
    Mesh mesh;
    mesh.setDrawMode( TRIANGLES );

    _resX = _resX + 1;
    _resY = _resY + 1;
    _resZ = _resZ + 1;

    if ( _resX < 2 ) _resX = 0;
    if ( _resY < 2 ) _resY = 0;
    if ( _resZ < 2 ) _resZ = 0;

    // halves //
    float halfW = _width * .5f;
    float halfH = _height * .5f;
    float halfD = _depth * .5f;

    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 texcoord;
    std::size_t vertOffset = 0;

    // TRIANGLES //

    // Front Face //
    normal = {0.f, 0.f, 1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Right Side Face //
    normal = {1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Left Side Face //
    normal = {-1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = -halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Back Face //
    normal = {0.f, 0.f, -1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * -_width + halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = -halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();


    // Top Face //
    normal = {0.f, -1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = -halfH;
            vert.z = texcoord.y * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Bottom Face //
    normal = {0.f, 1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = halfH;
            vert.z = texcoord.y * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }
    mesh.computeTangents();

    return mesh;
}